

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ulong uVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iCur;
  Parse *pPVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ushort uVar10;
  uint op;
  int iVar11;
  WhereTerm *pWVar12;
  CollSeq *pCVar13;
  CollSeq *pCVar14;
  Bitmask BVar15;
  ulong uVar16;
  bool bVar17;
  short sVar18;
  byte bVar19;
  ushort uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ExprList_item *pEVar24;
  byte bVar25;
  Expr *pEVar26;
  ExprList_item *pEVar27;
  undefined6 in_register_00000082;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  WhereLoop *pWVar33;
  bool bVar34;
  ulong uVar35;
  bool bVar36;
  char local_11c;
  Index *local_100;
  ulong local_c8;
  ulong local_b0;
  ulong local_98;
  Walker local_60;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar20 = (ushort)pOrderBy->nExpr;
    uVar29 = (ulong)uVar20;
    if (uVar20 < 0x40) {
      uVar21 = ~(-1L << ((byte)uVar20 & 0x3f));
      op = 0x183 - ((wctrlFlags & 0x803) == 0);
      uVar28 = (uint)uVar20;
      if (uVar28 != 0) {
        pEVar24 = pOrderBy->a;
        uVar30 = (ulong)uVar28;
        bVar17 = true;
        local_c8 = 0;
        local_b0 = 0;
        uVar23 = 0;
        pWVar33 = (WhereLoop *)0x0;
        uVar16 = 0;
LAB_001a71af:
        if (uVar16 != 0) {
          local_c8 = local_c8 | pWVar33->maskSelf;
        }
        pWVar33 = pLast;
        if ((uVar16 < nLoop) && (pWVar33 = pPath->aLoop[uVar16], (wctrlFlags >> 0xb & 1) != 0))
        goto LAB_001a7987;
        if ((pWVar33->wsFlags & 0x400) == 0) {
          local_11c = (char)wctrlFlags;
          if (local_11c < '\0') {
            (pWVar33->u).btree.nDistinctCol = 0;
          }
          iCur = pWInfo->pTabList->a[pWVar33->iTab].iCursor;
          uVar35 = 0;
LAB_001a723f:
          if ((uVar23 >> (uVar35 & 0x3f) & 1) == 0) {
            pEVar26 = pEVar24[uVar35].pExpr;
            while ((pEVar26 != (Expr *)0x0 && ((pEVar26->flags & 0x82000) != 0))) {
              if ((pEVar26->flags >> 0x13 & 1) == 0) {
                pEVar27 = (ExprList_item *)&pEVar26->pLeft;
              }
              else {
                pEVar27 = ((pEVar26->x).pList)->a;
              }
              pEVar26 = pEVar27->pExpr;
            }
            if (((pEVar26 == (Expr *)0x0) ||
                (((pEVar26->op != 0xa9 && (pEVar26->op != 0xa7)) || (pEVar26->iTable != iCur)))) ||
               (pWVar12 = sqlite3WhereFindTerm
                                    (&pWInfo->sWC,iCur,(int)pEVar26->iColumn,~local_c8,op,
                                     (Index *)0x0), pWVar12 == (WhereTerm *)0x0)) goto LAB_001a7251;
            if (pWVar12->eOperator == 1) {
              uVar32 = (ulong)pWVar33->nLTerm;
              bVar36 = uVar32 != 0;
              if (bVar36) {
                if (pWVar12 != *pWVar33->aLTerm) {
                  uVar31 = 0;
                  do {
                    if (uVar32 - 1 == uVar31) goto LAB_001a7251;
                    uVar1 = uVar31 + 1;
                    lVar22 = uVar31 + 1;
                    uVar31 = uVar1;
                  } while (pWVar12 != pWVar33->aLTerm[lVar22]);
                  bVar36 = uVar1 < uVar32;
                }
                if (bVar36) goto LAB_001a7345;
              }
              goto LAB_001a7251;
            }
LAB_001a7345:
            if (((pWVar12->eOperator & 0x82) != 0) && (-1 < pEVar26->iColumn)) {
              pPVar6 = pWInfo->pParse;
              pCVar14 = sqlite3ExprCollSeq(pPVar6,pEVar24[uVar35].pExpr);
              if (pCVar14 == (CollSeq *)0x0) {
                pCVar14 = pPVar6->db->pDfltColl;
              }
              pCVar13 = sqlite3ExprCompareCollSeq(pPVar6,pWVar12->pExpr);
              if (pCVar13 != (CollSeq *)0x0) {
                lVar22 = 0;
                do {
                  bVar19 = pCVar14->zName[lVar22];
                  bVar25 = pCVar13->zName[lVar22];
                  if (bVar19 == bVar25) {
                    if ((ulong)bVar19 == 0) goto LAB_001a73e8;
                  }
                  else if (""[bVar19] != ""[bVar25]) goto LAB_001a73e8;
                  lVar22 = lVar22 + 1;
                } while( true );
              }
              goto LAB_001a7251;
            }
            goto LAB_001a73f2;
          }
          goto LAB_001a7251;
        }
        uVar16 = uVar21;
        if ((pWVar33->u).vtab.isOrdered == '\0') {
          uVar16 = uVar23;
        }
        if ((wctrlFlags & 0x280) != 0x80) {
          uVar23 = uVar16;
        }
        goto LAB_001a79d9;
      }
      bVar17 = true;
      uVar23 = 0;
LAB_001a79d9:
      if (uVar23 == uVar21) {
        return (byte)uVar20;
      }
      uVar10 = 0xff;
      if (bVar17) {
        return -1;
      }
      while (uVar20 = uVar20 - 1, 1 < (long)uVar29) {
        uVar29 = uVar29 - 1;
        bVar17 = (-1L << ((byte)uVar29 & 0x3f) | uVar23) == 0xffffffffffffffff;
        if (bVar17) {
          uVar10 = uVar20 & 0xff;
        }
        if (bVar17) {
          return (i8)uVar10;
        }
      }
    }
  }
  return '\0';
LAB_001a73e8:
  if (bVar19 == bVar25) {
LAB_001a73f2:
    uVar23 = uVar23 | 1L << ((byte)uVar35 & 0x3f);
  }
LAB_001a7251:
  uVar35 = uVar35 + 1;
  if (uVar35 == uVar30) goto LAB_001a73ff;
  goto LAB_001a723f;
LAB_001a73ff:
  uVar28 = pWVar33->wsFlags;
  if ((uVar28 >> 0xc & 1) != 0) {
    bVar36 = false;
    goto LAB_001a788c;
  }
  if ((uVar28 >> 8 & 1) == 0) {
    local_100 = (pWVar33->u).btree.pIndex;
    if (local_100 == (Index *)0x0) {
      return '\0';
    }
    if ((local_100->field_0x63 & 4) != 0) {
      return '\0';
    }
    local_98 = (ulong)local_100->nKeyCol;
    uVar35 = (ulong)local_100->nColumn;
    bVar17 = -1 < (short)uVar28 && local_100->onError != '\0';
  }
  else {
    uVar35 = 1;
    local_100 = (Index *)0x0;
    local_98 = 0;
  }
  if ((int)uVar35 != 0) {
    uVar32 = 0;
    bVar9 = false;
    bVar19 = 0;
    bVar36 = false;
LAB_001a74cd:
    uVar10 = (pWVar33->u).btree.nEq;
    bVar8 = true;
    if ((uVar10 <= uVar32) || (uVar32 < pWVar33->nSkip)) {
LAB_001a754c:
      if (local_100 == (Index *)0x0) {
        bVar25 = 0;
        uVar28 = 0xffffffff;
      }
      else {
        sVar18 = local_100->aiColumn[uVar32];
        bVar25 = local_100->aSortOrder[uVar32] & 1;
        if (sVar18 == local_100->pTable->iPKey) {
          sVar18 = -1;
        }
        uVar28 = (uint)sVar18;
      }
      uVar31 = 0;
      if (bVar17) {
        bVar17 = true;
        if ((uVar10 <= uVar32) && (-1 < (int)uVar28)) {
          bVar17 = (local_100->pTable->aCol[uVar28].field_0x8 & 0xf) != 0;
        }
        if (uVar28 == 0xfffffffe) {
          bVar17 = false;
        }
      }
      else {
        bVar17 = false;
      }
      if (bVar8) {
        uVar31 = 0;
        bVar34 = bVar8;
LAB_001a75ec:
        if ((uVar23 >> (uVar31 & 0x3f) & 1) == 0) {
          pEVar26 = pEVar24[uVar31].pExpr;
          while ((pEVar26 != (Expr *)0x0 && ((pEVar26->flags & 0x82000) != 0))) {
            if ((pEVar26->flags >> 0x13 & 1) == 0) {
              pEVar27 = (ExprList_item *)&pEVar26->pLeft;
            }
            else {
              pEVar27 = ((pEVar26->x).pList)->a;
            }
            pEVar26 = pEVar27->pExpr;
          }
          if (pEVar26 == (Expr *)0x0) goto LAB_001a75f2;
          if ((wctrlFlags & 0xc0) == 0) {
            bVar8 = false;
          }
          if ((int)uVar28 < -1) {
            iVar11 = sqlite3ExprCompareSkip(pEVar26,local_100->aColExpr->a[uVar32].pExpr,iCur);
            if (iVar11 == 0) goto LAB_001a76bb;
            goto LAB_001a75f2;
          }
          if ((((pEVar26->op != 0xa9) && (pEVar26->op != 0xa7)) || (pEVar26->iTable != iCur)) ||
             (uVar28 != (int)pEVar26->iColumn)) goto LAB_001a75f2;
LAB_001a76bb:
          if (uVar28 != 0xffffffff) {
            pPVar6 = pWInfo->pParse;
            pCVar14 = sqlite3ExprCollSeq(pPVar6,pEVar24[uVar31].pExpr);
            if (pCVar14 == (CollSeq *)0x0) {
              pCVar14 = pPVar6->db->pDfltColl;
            }
            lVar22 = 0;
            do {
              bVar4 = pCVar14->zName[lVar22];
              bVar3 = local_100->azColl[uVar32][lVar22];
              if (bVar4 == bVar3) {
                if ((ulong)bVar4 == 0) goto LAB_001a772b;
              }
              else if (""[bVar4] != ""[bVar3]) goto LAB_001a772b;
              lVar22 = lVar22 + 1;
            } while( true );
          }
          goto LAB_001a773e;
        }
        goto LAB_001a75f2;
      }
      bVar7 = false;
      goto LAB_001a776c;
    }
    pWVar12 = pWVar33->aLTerm[uVar32];
    uVar5 = pWVar12->eOperator;
    if ((op & uVar5) == 0) {
      bVar8 = true;
      if ((uVar5 & 1) != 0) {
        uVar31 = uVar32;
        do {
          if (uVar10 - 1 == uVar31) goto LAB_001a7540;
          lVar22 = uVar31 + 1;
          uVar31 = uVar31 + 1;
        } while (pWVar33->aLTerm[lVar22]->pExpr != pWVar12->pExpr);
        bVar8 = false;
      }
    }
    else {
      if ((uVar5 & 0x180) != 0) {
        bVar17 = false;
      }
      bVar8 = true;
    }
LAB_001a7540:
    bVar34 = true;
    if ((op & uVar5) == 0) goto LAB_001a754c;
    goto LAB_001a7813;
  }
  bVar36 = true;
  goto LAB_001a7882;
LAB_001a772b:
  if (bVar4 == bVar3) {
LAB_001a773e:
    bVar7 = true;
    bVar8 = bVar34;
    if (local_11c < '\0') {
      (pWVar33->u).btree.nDistinctCol = (short)uVar32 + 1;
    }
    goto LAB_001a776c;
  }
LAB_001a75f2:
  uVar31 = uVar31 + 1;
  bVar34 = uVar31 < uVar30 && bVar8;
  if (uVar31 >= uVar30 || !bVar8) goto LAB_001a775c;
  goto LAB_001a75ec;
LAB_001a775c:
  bVar7 = false;
  bVar8 = bVar34;
LAB_001a776c:
  if (((wctrlFlags & 0x40) == 0) && (bVar8)) {
    if (bVar9) {
      if ((bVar25 ^ bVar19) != (pOrderBy->a[uVar31 & 0xffffffff].fg.sortFlags & 1)) {
        bVar7 = false;
      }
      bVar9 = true;
    }
    else {
      bVar4 = pOrderBy->a[uVar31 & 0xffffffff].fg.sortFlags;
      bVar19 = bVar4 & 1 ^ bVar25;
      bVar9 = true;
      if ((bVar4 & 1) != bVar25) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar16 & 0x3f);
      }
    }
  }
  if (bVar7) {
    if ((pOrderBy->a[uVar31 & 0xffffffff].fg.sortFlags & 2) != 0) {
      if (uVar32 != (pWVar33->u).btree.nEq) goto LAB_001a77f5;
      pbVar2 = (byte *)((long)&pWVar33->wsFlags + 2);
      *pbVar2 = *pbVar2 | 8;
    }
    if (uVar28 == 0xffffffff) {
      bVar36 = true;
    }
    uVar23 = uVar23 | 1L << (uVar31 & 0x3f);
    bVar34 = true;
  }
  else {
LAB_001a77f5:
    bVar34 = false;
    if (uVar32 < local_98) {
      bVar17 = false;
    }
    if (uVar32 == 0) {
      bVar17 = false;
    }
  }
LAB_001a7813:
  if ((!bVar34) || (uVar32 = uVar32 + 1, uVar35 <= uVar32)) goto LAB_001a7871;
  goto LAB_001a74cd;
LAB_001a7871:
  bVar36 = !bVar36;
LAB_001a7882:
  bVar36 = (bool)(!bVar17 & bVar36);
LAB_001a788c:
  if (bVar36) {
    bVar17 = false;
  }
  else {
    local_b0 = local_b0 | pWVar33->maskSelf;
    uVar35 = 0;
    pEVar27 = pEVar24;
    do {
      uVar32 = 1L << ((byte)uVar35 & 0x3f);
      if ((uVar23 >> (uVar35 & 0x3f) & 1) == 0) {
        pEVar26 = pEVar27->pExpr;
        if (pEVar26 == (Expr *)0x0) {
          BVar15 = 0;
        }
        else {
          BVar15 = sqlite3WhereExprUsageNN(&pWInfo->sMaskSet,pEVar26);
        }
        if (BVar15 == 0) {
          local_60.eCode = 1;
          local_60.xExprCallback = exprNodeIsConstant;
          local_60.xSelectCallback = sqlite3SelectWalkFail;
          local_60.u.n = 0;
          if (pEVar26 != (Expr *)0x0) {
            walkExpr(&local_60,pEVar26);
          }
          if (local_60.eCode == 0) goto LAB_001a796b;
        }
        if ((~local_b0 & BVar15) != 0) {
          uVar32 = 0;
        }
        uVar23 = uVar23 | uVar32;
      }
LAB_001a796b:
      uVar35 = uVar35 + 1;
      pEVar27 = pEVar27 + 1;
    } while (uVar29 != uVar35);
    bVar17 = true;
  }
LAB_001a7987:
  if (((!bVar17) || (uVar21 <= uVar23)) || (bVar36 = nLoop <= uVar16, uVar16 = uVar16 + 1, bVar36))
  goto LAB_001a79d9;
  goto LAB_001a71af;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MAX|WHERE_ORDERBY_MIN) ){
    eqOpMask |= WO_IN;
  }
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered
       && ((wctrlFlags&(WHERE_DISTINCTBY|WHERE_SORTBYGROUP))!=WHERE_DISTINCTBY)
      ){
        obSat = obDone;
      }
      break;
    }else if( wctrlFlags & WHERE_DISTINCTBY ){
      pLoop->u.btree.nDistinctCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
      if( NEVER(pOBExpr==0) ) continue;
      if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags &
               (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        Parse *pParse = pWInfo->pParse;
        CollSeq *pColl1 = sqlite3ExprNNCollSeq(pParse, pOrderBy->a[i].pExpr);
        CollSeq *pColl2 = sqlite3ExprCompareCollSeq(pParse, pTerm->pExpr);
        assert( pColl1 );
        if( pColl2==0 || sqlite3StrICmp(pColl1->zName, pColl2->zName) ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        /* All relevant terms of the index must also be non-NULL in order
        ** for isOrderDistinct to be true.  So the isOrderDistint value
        ** computed here might be a false positive.  Corrections will be
        ** made at tag-20210426-1 below */
        isOrderDistinct = IsUniqueIndex(pIndex)
                          && (pLoop->wsFlags & WHERE_SKIPSCAN)==0;
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing).  Except, IS and ISNULL
          ** terms imply that the index is not UNIQUE NOT NULL in which case
          ** the loop need to be marked as not order-distinct because it can
          ** have repeated NULL rows.
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...))
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.
          */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & (WO_ISNULL|WO_IS) ){
              testcase( eOp & WO_ISNULL );
              testcase( eOp & WO_IS );
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j] & KEYINFO_ORDER_DESC;
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered.  tag-20210426-1
        */
        if( isOrderDistinct ){
          if( iColumn>=0
           && j>=pLoop->u.btree.nEq
           && pIndex->pTable->aCol[iColumn].notNull==0
          ){
            isOrderDistinct = 0;
          }
          if( iColumn==XN_EXPR ){
            isOrderDistinct = 0;
          }
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( NEVER(pOBExpr==0) ) continue;
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          if( wctrlFlags & WHERE_DISTINCTBY ){
            pLoop->u.btree.nDistinctCol = j+1;
          }
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)
                           != (pOrderBy->a[i].fg.sortFlags&KEYINFO_ORDER_DESC)
            ){
              isMatch = 0;
            }
          }else{
            rev = revIdx ^ (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_DESC);
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch && (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_BIGNULL) ){
          if( j==pLoop->u.btree.nEq ){
            pLoop->wsFlags |= WHERE_BIGNULL_SORT;
          }else{
            isMatch = 0;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = ALWAYS(i<BMS) ? MASKBIT(i) - 1 : 0;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}